

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

bool __thiscall backward::SourceFile::not_isempty::operator()(not_isempty *this,value_type *p)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__rhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  
  uVar2 = std::__cxx11::string::begin();
  uVar3 = std::__cxx11::string::end();
  std::
  find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,backward::SourceFile::not_isspace>
            (uVar2,uVar3);
  __rhs = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator==(in_stack_ffffffffffffffd0,__rhs);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool operator()(const lines_t::value_type &p) {
      return !(std::find_if(p.second.begin(), p.second.end(), not_isspace()) ==
               p.second.end());
    }